

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_construction.h
# Opt level: O3

void ximu::PacketConstruction::
     constructWriteDateTimePacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (DateTimeData *data,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               dest)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  size_t sVar13;
  size_t sVar14;
  uchar uVar15;
  pointer puVar16;
  initializer_list<unsigned_char> __l;
  uchar local_60;
  byte local_5f;
  byte local_5e;
  byte local_5d;
  byte local_5c;
  byte local_5b;
  byte local_5a;
  undefined1 local_59;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  allocator_type local_31;
  
  local_60 = '\x05';
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)dest.container;
  sVar13 = DateTimeData::year(data);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar13 - 2000 >> 2;
  sVar14 = DateTimeData::year(data);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar14 - 2000;
  local_5f = (char)(sVar14 - 2000) +
             ((byte)(SUB164(auVar2 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5 |
             ((byte)(((int)(sVar13 - 2000) +
                     (SUB164(auVar1 * ZEXT816(0x28f5c28f5c28f5c3),8) >> 2) * -100) * 0x67 >> 8) &
             0x3c) << 2;
  sVar13 = DateTimeData::month(data);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar13 >> 2;
  sVar14 = DateTimeData::month(data);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = sVar14;
  local_5e = (char)sVar14 +
             ((byte)(SUB164(auVar4 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5 |
             ((byte)(((int)sVar13 + (SUB164(auVar3 * ZEXT816(0x28f5c28f5c28f5c3),8) >> 2) * -100) *
                     0x67 >> 8) & 0x3c) << 2;
  sVar13 = DateTimeData::day(data);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = sVar13 >> 2;
  sVar14 = DateTimeData::day(data);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = sVar14;
  local_5d = (char)sVar14 +
             ((byte)(SUB164(auVar6 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5 |
             ((byte)(((int)sVar13 + (SUB164(auVar5 * ZEXT816(0x28f5c28f5c28f5c3),8) >> 2) * -100) *
                     0x67 >> 8) & 0x3c) << 2;
  sVar13 = DateTimeData::hours(data);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = sVar13 >> 2;
  sVar14 = DateTimeData::hours(data);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = sVar14;
  local_5c = (char)sVar14 +
             ((byte)(SUB164(auVar8 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5 |
             ((byte)(((int)sVar13 + (SUB164(auVar7 * ZEXT816(0x28f5c28f5c28f5c3),8) >> 2) * -100) *
                     0x67 >> 8) & 0x3c) << 2;
  sVar13 = DateTimeData::minutes(data);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = sVar13 >> 2;
  sVar14 = DateTimeData::minutes(data);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = sVar14;
  local_5b = (char)sVar14 +
             ((byte)(SUB164(auVar10 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5 |
             ((byte)(((int)sVar13 + (SUB164(auVar9 * ZEXT816(0x28f5c28f5c28f5c3),8) >> 2) * -100) *
                     0x67 >> 8) & 0x3c) << 2;
  sVar13 = DateTimeData::seconds(data);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = sVar13 >> 2;
  sVar14 = DateTimeData::seconds(data);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = sVar14;
  local_5a = (char)sVar14 +
             ((byte)(SUB164(auVar12 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5 |
             ((byte)(((int)sVar13 + (SUB164(auVar11 * ZEXT816(0x28f5c28f5c28f5c3),8) >> 2) * -100) *
                     0x67 >> 8) & 0x3c) << 2;
  local_59 = 0;
  __l._M_len = 8;
  __l._M_array = &local_60;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,__l,&local_31);
  if (decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + ~(ulong)local_58 == (pointer)0x0) {
    uVar15 = '\0';
  }
  else {
    puVar16 = (pointer)0x0;
    uVar15 = '\0';
    do {
      uVar15 = uVar15 + *(uchar *)((long)local_58 + (long)puVar16);
      puVar16 = puVar16 + 1;
    } while (decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + ~(ulong)local_58 != puVar16);
  }
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[-1] = uVar15;
  PacketEncoding::
  encodePacket<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_58,
             (long)decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start - (long)local_58,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  if (local_58 != (undefined1  [8])0x0) {
    operator_delete((void *)local_58);
  }
  return;
}

Assistant:

static void constructWriteDateTimePacket(const DateTimeData& data,
                                         OutputIterator dest) {
  std::vector<unsigned char> decoded = {
    static_cast<unsigned char>(PacketHeaders::WRITE_DATETIME),
    static_cast<unsigned char>((((((data.year() - 2000) % 100) / 10) << 4)
      | (data.year() - 2000) % 10)),
    static_cast<unsigned char>(((((data.month() % 100) / 10) << 4)
      | (data.month() % 10))),
    static_cast<unsigned char>(((((data.day() % 100) / 10) << 4)	
      | (data.day() % 10))),
    static_cast<unsigned char>(((((data.hours() % 100) / 10) << 4)
      | (data.hours() % 10))),
    static_cast<unsigned char>(((((data.minutes() % 100) / 10) << 4)
      | (data.minutes() % 10))),
     static_cast<unsigned char>(((((data.seconds() % 100) / 10) << 4)
      | (data.seconds() % 10))),
      0
  };
  decoded.back() = checksum(decoded.begin(), decoded.size() - 1);
  PacketEncoding::encodePacket(decoded.begin(), decoded.end(), dest);
}